

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

void do_cmd_keymaps(char *title,wchar_t row)

{
  menu_conflict *m;
  region_conflict loc;
  
  loc.col = 0;
  loc.row = 0;
  loc.width = 0;
  loc.page_rows = 0xc;
  screen_save();
  clear_from(L'\0');
  m = keymap_menu;
  if (keymap_menu == (menu_conflict *)0x0) {
    m = menu_new_action(keymap_actions,5);
    keymap_menu = m;
    m->title = title;
    m->selections = "abcdefghijklmnopqrstuvwxyz";
    m->browse_hook = keymap_browse_hook;
  }
  menu_layout(m,&loc);
  menu_select(keymap_menu,0,false);
  screen_load();
  return;
}

Assistant:

static void do_cmd_keymaps(const char *title, int row)
{
	region loc = {0, 0, 0, 12};

	screen_save();
	clear_from(0);

	if (!keymap_menu) {
		keymap_menu = menu_new_action(keymap_actions,
				N_ELEMENTS(keymap_actions));
	
		keymap_menu->title = title;
		keymap_menu->selections = lower_case;
		keymap_menu->browse_hook = keymap_browse_hook;
	}

	menu_layout(keymap_menu, &loc);
	menu_select(keymap_menu, 0, false);

	screen_load();
}